

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

cmStateSnapshot * __thiscall
cmState::Pop(cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot)

{
  pointer pBVar1;
  pointer pBVar2;
  iterator it;
  PositionType position;
  bool bVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  PointerType pSVar6;
  PositionType pos;
  PositionType prevPos;
  iterator local_58;
  iterator local_48;
  
  local_58.Tree = (originSnapshot->Position).Tree;
  local_58.Position = (originSnapshot->Position).Position;
  local_48.Tree = (originSnapshot->Position).Tree;
  local_48.Position = (originSnapshot->Position).Position;
  cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++(&local_48);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  pBVar1 = (pBVar5->IncludeDirectories).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (pBVar5->IncludeDirectories).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pSVar4->IncludeDirectoryPosition = ((long)pBVar1 - (long)pBVar2 >> 4) * -0x5555555555555555;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  pBVar1 = (pBVar5->CompileDefinitions).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (pBVar5->CompileDefinitions).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pSVar4->CompileDefinitionsPosition = ((long)pBVar1 - (long)pBVar2 >> 4) * -0x5555555555555555;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  pBVar1 = (pBVar5->CompileOptions).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (pBVar5->CompileOptions).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pSVar4->CompileOptionsPosition = ((long)pBVar1 - (long)pBVar2 >> 4) * -0x5555555555555555;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  pBVar1 = (pBVar5->LinkOptions).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (pBVar5->LinkOptions).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pSVar4->LinkOptionsPosition = ((long)pBVar1 - (long)pBVar2 >> 4) * -0x5555555555555555;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  pBVar1 = (pBVar5->LinkDirectories).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (pBVar5->LinkDirectories).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pSVar4->LinkDirectoriesPosition = ((long)pBVar1 - (long)pBVar2 >> 4) * -0x5555555555555555;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  (pBVar5->CurrentScope).Tree = local_48.Tree;
  (pBVar5->CurrentScope).Position = local_48.Position;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_58);
  if ((pSVar4->Keep == false) &&
     (((long)(this->SnapshotData).Data.
             super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->SnapshotData).Data.
             super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x4ec4ec4ec4ec4ec5 -
      local_58.Position == 0)) {
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_58);
    pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
    bVar3 = cmLinkedTree<cmDefinitions>::iterator::operator!=(&pSVar4->Vars,pSVar6->Vars);
    if (bVar3) {
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_58);
      if (((long)(this->VarTree).Data.
                 super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->VarTree).Data.
                 super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 -
          (pSVar4->Vars).Position != 0) {
        __assert_fail("this->VarTree.IsLast(pos->Vars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmState.cxx"
                      ,0x3fe,"cmStateSnapshot cmState::Pop(const cmStateSnapshot &)");
      }
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_58);
      cmLinkedTree<cmDefinitions>::Pop(&this->VarTree,pSVar4->Vars);
    }
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_58);
    pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_48);
    bVar3 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::iterator::operator!=(&pSVar4->ExecutionListFile,pSVar6->ExecutionListFile);
    if (bVar3) {
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_58);
      if ((long)(this->ExecutionListFiles).Data.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ExecutionListFiles).Data.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5 !=
          (pSVar4->ExecutionListFile).Position) {
        __assert_fail("this->ExecutionListFiles.IsLast(pos->ExecutionListFile)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmState.cxx"
                      ,0x402,"cmStateSnapshot cmState::Pop(const cmStateSnapshot &)");
      }
      pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_58);
      cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Pop(&this->ExecutionListFiles,pSVar4->ExecutionListFile);
    }
    it.Position = local_58.Position;
    it.Tree = local_58.Tree;
    cmLinkedTree<cmStateDetail::SnapshotDataType>::Pop(&this->SnapshotData,it);
  }
  position.Position = local_48.Position;
  position.Tree = local_48.Tree;
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,position);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::Pop(cmStateSnapshot const& originSnapshot)
{
  cmStateDetail::PositionType pos = originSnapshot.Position;
  cmStateDetail::PositionType prevPos = pos;
  ++prevPos;
  prevPos->IncludeDirectoryPosition =
    prevPos->BuildSystemDirectory->IncludeDirectories.size();
  prevPos->CompileDefinitionsPosition =
    prevPos->BuildSystemDirectory->CompileDefinitions.size();
  prevPos->CompileOptionsPosition =
    prevPos->BuildSystemDirectory->CompileOptions.size();
  prevPos->LinkOptionsPosition =
    prevPos->BuildSystemDirectory->LinkOptions.size();
  prevPos->LinkDirectoriesPosition =
    prevPos->BuildSystemDirectory->LinkDirectories.size();
  prevPos->BuildSystemDirectory->CurrentScope = prevPos;

  if (!pos->Keep && this->SnapshotData.IsLast(pos)) {
    if (pos->Vars != prevPos->Vars) {
      assert(this->VarTree.IsLast(pos->Vars));
      this->VarTree.Pop(pos->Vars);
    }
    if (pos->ExecutionListFile != prevPos->ExecutionListFile) {
      assert(this->ExecutionListFiles.IsLast(pos->ExecutionListFile));
      this->ExecutionListFiles.Pop(pos->ExecutionListFile);
    }
    this->SnapshotData.Pop(pos);
  }

  return { this, prevPos };
}